

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCommon.h
# Opt level: O2

void __thiscall ParserWrapper::~ParserWrapper(ParserWrapper *this)

{
  luna::Lexer::~Lexer(&this->lexer_);
  luna::String::~String(&this->name_);
  luna::State::~State(&this->state_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit ParserWrapper(const std::string &str = "")
        : iss_(str), state_(), name_("parser"),
          lexer_(&state_, &name_, std::bind(&io::text::InStringStream::GetChar, &iss_))
    {
    }